

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O3

void libcellml::generateEquivalenceMap
               (ComponentPtr *component,EquivalenceMap *map,IndexStack *indexStack)

{
  pointer *ppuVar1;
  iterator __position;
  size_t sVar2;
  ulong uVar3;
  ComponentPtr c;
  unsigned_long local_48;
  ComponentEntity local_40;
  
  local_48 = 0;
  sVar2 = ComponentEntity::componentCount
                    (&((component->
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                      ->super_ComponentEntity);
  if (sVar2 != 0) {
    do {
      __position._M_current =
           (indexStack->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (indexStack->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)indexStack,__position,
                   &local_48);
      }
      else {
        *__position._M_current = local_48;
        (indexStack->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      ComponentEntity::component
                (&local_40,
                 (size_t)(component->
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr);
      recordVariableEquivalences((ComponentPtr *)&local_40,map,indexStack);
      generateEquivalenceMap((ComponentPtr *)&local_40,map,indexStack);
      ppuVar1 = &(indexStack->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + -1;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
      }
      uVar3 = local_48 + 1;
      local_48 = uVar3;
      sVar2 = ComponentEntity::componentCount
                        (&((component->
                           super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr)->super_ComponentEntity);
    } while (uVar3 < sVar2);
  }
  return;
}

Assistant:

void generateEquivalenceMap(const ComponentPtr &component, EquivalenceMap &map, IndexStack &indexStack)
{
    for (size_t index = 0; index < component->componentCount(); ++index) {
        indexStack.push_back(index);
        auto c = component->component(index);
        recordVariableEquivalences(c, map, indexStack);
        generateEquivalenceMap(c, map, indexStack);
        indexStack.pop_back();
    }
}